

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbcx.h
# Opt level: O2

void rgbcx::encode_bc1(void *pDst,uint8_t *pPixels,uint32_t flags,uint32_t total_orderings_to_try,
                      uint32_t total_orderings_to_try3)

{
  char *pcVar1;
  byte bVar2;
  byte bVar3;
  undefined8 uVar4;
  byte bVar5;
  undefined1 uVar20;
  short sVar6;
  uint32_t i;
  uint uVar7;
  uint uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  int iVar11;
  uint32_t uVar12;
  undefined4 uVar13;
  long lVar14;
  byte *pbVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 uVar26;
  short sVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  uint uVar27;
  uint32_t lr;
  int iVar28;
  short sVar29;
  uint32_t lg;
  uint uVar30;
  int iVar31;
  float fVar32;
  int iVar33;
  ulong uVar34;
  int iVar35;
  ulong uVar36;
  ulong uVar37;
  uint32_t uVar38;
  uint uVar39;
  int iVar40;
  int i_7;
  uint32_t hg;
  uint uVar41;
  int iVar42;
  int iVar43;
  uint32_t uVar44;
  uint uVar45;
  int iVar46;
  bool bVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  uint32_t local_348;
  uint local_340;
  uint local_338;
  uint local_334;
  byte *local_330;
  byte *local_328;
  ulong local_320;
  ulong local_318;
  byte *local_310;
  ulong local_308;
  byte *local_300;
  undefined8 local_2f8;
  uint32_t local_2f0;
  uint32_t local_2ec;
  bc1_encode_results results;
  uint32_t local_2b8;
  uint32_t local_2b0;
  int trial_hg;
  float local_2a0;
  float local_29c;
  int trial_hb;
  float local_294;
  float local_290;
  hist3 h_1;
  uint32_t local_288;
  uint32_t local_284;
  byte *local_280;
  uint local_278;
  uint local_274;
  uint local_270;
  uint local_26c;
  int trial_hr;
  float fStack_264;
  float fStack_260;
  undefined4 uStack_25c;
  int trial_lb;
  uint8_t uStack_254;
  uint8_t uStack_253;
  uint8_t uStack_252;
  uint8_t uStack_251;
  uint8_t auStack_250 [8];
  ulong local_248;
  ulong local_240;
  ulong local_238;
  ulong local_230;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  byte *local_210;
  uint32_t local_208;
  undefined4 uStack_204;
  int local_200;
  uint local_1fc;
  uint8_t *local_1f8;
  byte *local_1f0;
  byte *local_1e8;
  uint32_t local_1dc;
  uint local_1d8;
  uint32_t local_1d4;
  undefined1 *local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  uint32_t local_1b8;
  int local_1b4;
  uint local_1b0;
  int local_1ac;
  uint local_1a8;
  uint local_1a4;
  int local_1a0;
  uint local_19c;
  uint8_t round_sels [16];
  vec3F xl;
  uint8_t uStack_11c;
  uint8_t uStack_11b;
  uint8_t uStack_11a;
  uint8_t uStack_119;
  uint8_t trial_sels [16];
  undefined8 local_c8;
  vec3F xh;
  uint8_t uStack_7c;
  uint8_t uStack_7b;
  uint8_t uStack_7a;
  uint8_t uStack_79;
  
  local_1dc = total_orderings_to_try3;
  local_1b8 = total_orderings_to_try;
  bVar5 = *pPixels;
  uVar25 = (uint)bVar5;
  bVar2 = pPixels[1];
  local_2f8 = (byte *)(ulong)bVar2;
  local_210 = local_2f8;
  bVar3 = pPixels[2];
  local_320 = (ulong)bVar3;
  local_218 = local_320;
  uVar7 = 0xf;
  uVar19 = 0xf;
  do {
    bVar47 = uVar7 == 0;
    uVar7 = uVar7 - 1;
    if (bVar47) {
      encode_bc1_solid_block(pDst,(uint)bVar5,(uint)bVar2,(uint)bVar3,(flags & 0x18) != 0);
      return;
    }
  } while (((pPixels[uVar19 * 4] == bVar5) && (pPixels[uVar19 * 4 + 1] == bVar2)) &&
          (lVar14 = uVar19 * 4, uVar19 = (ulong)uVar7, pPixels[lVar14 + 2] == bVar3));
  local_1d0 = (undefined1 *)pDst;
  uVar7 = (uint)bVar5;
  local_1fc = (uint)(bVar5 == bVar2 && bVar5 == bVar3);
  local_278 = (uint)((byte)(bVar2 | bVar5 | bVar3) < 4);
  lVar14 = 1;
  local_26c = (uint)bVar3;
  local_270 = (uint)bVar2;
  local_274 = uVar7;
  while( true ) {
    local_300 = (byte *)(ulong)uVar7;
    iVar23 = (int)local_2f8;
    iVar31 = (int)local_320;
    if (lVar14 == 0x10) break;
    bVar5 = pPixels[lVar14 * 4];
    bVar2 = pPixels[lVar14 * 4 + 2];
    bVar3 = pPixels[lVar14 * 4 + 1];
    local_1fc = local_1fc & (bVar2 == bVar5 && bVar5 == bVar3);
    local_278 = local_278 | (byte)(bVar3 | bVar5 | bVar2) < 4;
    uVar22 = (uint)bVar5;
    if (uVar25 <= uVar22) {
      uVar25 = uVar22;
    }
    if ((uint)local_210 <= (uint)bVar3) {
      local_210 = (byte *)(ulong)(uint)bVar3;
    }
    if ((uint)local_218 <= (uint)bVar2) {
      local_218 = (ulong)(uint)bVar2;
    }
    if (uVar22 <= local_274) {
      local_274 = uVar22;
    }
    uVar27 = (uint)bVar3;
    if (uVar27 <= local_270) {
      local_270 = uVar27;
    }
    uVar30 = (uint)bVar2;
    if (uVar30 <= local_26c) {
      local_26c = uVar30;
    }
    uVar7 = uVar7 + uVar22;
    local_2f8 = (byte *)(ulong)(iVar23 + uVar27);
    local_320 = (ulong)(iVar31 + uVar30);
    lVar14 = lVar14 + 1;
  }
  uVar22 = uVar7 + 8 >> 4;
  uVar27 = iVar23 + 8U >> 4;
  uVar19 = (ulong)uVar27;
  results.m_3color = false;
  results.hg = 0;
  results.hb = 0;
  uVar30 = iVar31 + 8U >> 4;
  local_1f8 = results.sels;
  results.lr = 0;
  results.lg = 0;
  results.lb = 0;
  results.hr = 0;
  local_1c8 = (ulong)uVar22;
  local_1c0 = (ulong)uVar30;
  local_200 = 2;
  if (((flags & 0xffc00112) == 0) && (((flags & 8) == 0 || (local_278 == 0)))) {
    encode_bc1_pick_initial
              ((color32 *)pPixels,flags,local_1fc != 0,local_274,local_270,local_26c,uVar25,
               (uint)local_210,(uint)local_218,uVar22,uVar27,uVar30,uVar7,iVar23,iVar31,&results.lr,
               &results.lg,&results.lb,&results.hr,&results.hg,&results.hb);
    local_220 = results._0_8_ & 0xffffffff;
    local_228 = (ulong)(uint)results.lg;
    local_230 = results._8_8_ & 0xffffffff;
    local_238 = (ulong)(uint)results.hr;
    local_240 = results._16_8_ & 0xffffffff;
    local_248 = (ulong)(uint)results.hb;
    bc1_find_sels4_noerr
              ((color32 *)pPixels,results.lr,results.lg,results.lb,results.hr,results.hg,results.hb,
               results.sels);
    iVar31 = 2 - (uint)((flags & 4) == 0);
    local_328 = g_bc1_match5_equals_1 + local_1c8 * 3;
    local_330 = g_bc1_match6_equals_1 + uVar19 * 3;
    lVar14 = local_1c0 * 3;
    local_318 = 0xffffffffffffffff;
    while( true ) {
      bVar47 = iVar31 == 0;
      iVar31 = iVar31 + -1;
      if (bVar47) break;
      bVar47 = compute_least_squares_endpoints4_rgb
                         ((color32 *)pPixels,results.sels,(vec3F *)round_sels,(vec3F *)trial_sels,
                          (int)local_300,(int)local_2f8,(int)local_320);
      uVar4 = _trial_lb;
      if (bVar47) {
        precise_round_565((vec3F *)round_sels,(vec3F *)trial_sels,&trial_hr,&trial_hg,&trial_hb,
                          (int *)&xl,(int *)&xh,&trial_lb);
        fVar32 = xl.c[0];
        fVar49 = xh.c[0];
      }
      else {
        fVar32 = (float)(uint)*local_328;
        fVar49 = (float)(uint)*local_330;
        trial_lb._1_3_ = 0;
        trial_lb._0_1_ = g_bc1_match5_equals_1[lVar14];
        _uStack_254 = SUB84(uVar4,4);
        trial_hr = (uint)local_328[1];
        trial_hg = (uint)local_330[1];
        trial_hb = (uint)(byte)g_bc1_match5_equals_1[lVar14 + 1];
      }
      iVar33 = trial_hr;
      iVar28 = trial_hb;
      iVar23 = trial_hg;
      iVar42 = trial_lb;
      if ((((float)results.lr == fVar32) && ((float)results.lg == fVar49)) &&
         (((results.lb == trial_lb && ((results.hr == trial_hr && (results.hg == trial_hg)))) &&
          (results.hb == trial_hb)))) break;
      bc1_find_sels4_noerr
                ((color32 *)pPixels,(uint32_t)fVar32,(uint32_t)fVar49,trial_lb,trial_hr,trial_hg,
                 trial_hb,results.sels);
      results.lg = (int)fVar49;
      results.lr = (int)fVar32;
      results.hr = iVar33;
      results.lb = iVar42;
      results.hb = iVar28;
      results.hg = iVar23;
    }
  }
  else {
    local_1ac = ((flags >> 0xe & 1) != 0) + 1;
    local_1b0 = flags & 0xfffffdbf | 0x40;
    local_1b4 = 2 - (uint)((flags & 4) == 0);
    local_280 = g_bc1_match5_equals_1 + (ulong)uVar22 * 3;
    local_1e8 = g_bc1_match6_equals_1 + uVar19 * 3;
    local_1f0 = g_bc1_match5_equals_1 + (ulong)uVar30 * 3;
    local_318 = 0xffffffffffffffff;
    local_248 = 0;
    local_240 = 0;
    local_238 = 0;
    local_230 = 0;
    local_228 = 0;
    local_220 = 0;
    iVar31 = 0;
    while (iVar31 != local_1ac) {
      uVar7 = flags;
      if (iVar31 == 1) {
        uVar7 = local_1b0;
      }
      local_1a0 = iVar31;
      encode_bc1_pick_initial
                ((color32 *)pPixels,uVar7,local_1fc != 0,local_274,local_270,local_26c,uVar25,
                 (int)local_210,(int)local_218,uVar22,uVar27,uVar30,(int)local_300,(int)local_2f8,
                 (int)local_320,&trial_lb,&trial_hr,&trial_hg,&trial_hb,(int *)&local_334,
                 (int *)&local_338);
      uVar9 = trial_hb;
      iVar31 = trial_hg;
      uVar7 = local_334;
      local_1d4 = trial_lb;
      local_1d8 = trial_hr;
      uVar37 = (ulong)local_334;
      uVar34 = (ulong)local_338;
      uVar8 = bc1_find_sels4(flags,(color32 *)pPixels,trial_lb,trial_hr,trial_hg,trial_hb,local_334,
                             local_338,round_sels,0xffffffff);
      local_308 = CONCAT44(local_308._4_4_,uVar7);
      local_1a8 = uVar9;
      local_1a4 = iVar31;
      local_330 = (byte *)CONCAT44(local_330._4_4_,iVar31);
      local_328 = (byte *)CONCAT44(local_328._4_4_,local_1d8);
      uVar18 = uVar34;
      iVar31 = local_1b4;
      uVar10 = local_1d4;
      while( true ) {
        uVar12 = (uint32_t)uVar18;
        pbVar15 = (byte *)(ulong)uVar8;
        bVar47 = iVar31 == 0;
        iVar31 = iVar31 + -1;
        if (bVar47) break;
        local_310 = pbVar15;
        bVar47 = compute_least_squares_endpoints4_rgb
                           ((color32 *)pPixels,round_sels,&xl,&xh,(int)local_300,(int)local_2f8,
                            (int)local_320);
        if (bVar47) {
          precise_round_565(&xl,&xh,(int *)&local_288,(int *)&h_1,(int *)&local_19c,
                            (int *)&local_2ec,(int *)&local_2f0,(int *)&local_284);
          uVar18 = (ulong)local_19c;
          uVar38 = local_284;
          uVar44 = local_288;
          lr = local_2ec;
          lg = local_2f0;
          hg = _h_1;
        }
        else {
          lr = (uint32_t)*local_280;
          lg = (uint32_t)*local_1e8;
          uVar38 = (uint32_t)*local_1f0;
          uVar44 = (uint32_t)local_280[1];
          hg = (uint32_t)local_1e8[1];
          uVar18 = (ulong)local_1f0[1];
        }
        pbVar15 = local_310;
        if (((uVar10 == lr) && ((uint32_t)local_328 == lg)) &&
           (((uint32_t)local_330 == uVar38 &&
            (((uVar9 == uVar44 && ((uint32_t)local_308 == hg)) && (uVar12 == (uint32_t)uVar18))))))
        {
          trial_lb = uVar10;
          trial_hr = (uint32_t)local_328;
          trial_hg = (uint32_t)local_330;
          trial_hb = uVar9;
          local_334 = (uint32_t)local_308;
          local_338 = uVar12;
          break;
        }
        _local_208 = CONCAT44(uStack_204,uVar12);
        uVar7 = (uint)local_310;
        uVar8 = bc1_find_sels4(flags,(color32 *)pPixels,lr,lg,uVar38,uVar44,hg,(uint32_t)uVar18,
                               trial_sels,uVar7);
        if (uVar7 <= uVar8) {
          trial_lb = uVar10;
          trial_hr = (uint32_t)local_328;
          trial_hg = (uint32_t)local_330;
          trial_hb = uVar9;
          local_334 = (uint32_t)local_308;
          local_338 = local_208;
          uVar12 = local_208;
          break;
        }
        round_sels[4] = trial_sels[4];
        round_sels[5] = trial_sels[5];
        round_sels[6] = trial_sels[6];
        round_sels[7] = trial_sels[7];
        round_sels[0] = trial_sels[0];
        round_sels[1] = trial_sels[1];
        round_sels[2] = trial_sels[2];
        round_sels[3] = trial_sels[3];
        round_sels[0xc] = trial_sels[0xc];
        round_sels[0xd] = trial_sels[0xd];
        round_sels[0xe] = trial_sels[0xe];
        round_sels[0xf] = trial_sels[0xf];
        round_sels[8] = trial_sels[8];
        round_sels[9] = trial_sels[9];
        round_sels[10] = trial_sels[10];
        round_sels[0xb] = trial_sels[0xb];
        local_308 = CONCAT44(local_308._4_4_,hg);
        local_330 = (byte *)CONCAT44(local_330._4_4_,uVar38);
        local_328 = (byte *)CONCAT44(local_328._4_4_,lg);
        uVar9 = uVar44;
        uVar10 = lr;
      }
      if ((uint)pbVar15 <= (uint)local_318) {
        results.lg = (uint32_t)local_328;
        results.lr = uVar10;
        results.hr = uVar9;
        results.lb = (int)local_330;
        results.hb = uVar12;
        results.hg = (int)local_308;
        results.sels[0] = round_sels[0];
        results.sels[1] = round_sels[1];
        results.sels[2] = round_sels[2];
        results.sels[3] = round_sels[3];
        results.sels[4] = round_sels[4];
        results.sels[5] = round_sels[5];
        results.sels[6] = round_sels[6];
        results.sels[7] = round_sels[7];
        results.sels[8] = round_sels[8];
        results.sels[9] = round_sels[9];
        results.sels[10] = round_sels[10];
        results.sels[0xb] = round_sels[0xb];
        results.sels[0xc] = round_sels[0xc];
        results.sels[0xd] = round_sels[0xd];
        results.sels[0xe] = round_sels[0xe];
        results.sels[0xf] = round_sels[0xf];
        local_318 = (ulong)pbVar15 & 0xffffffff;
        local_248 = uVar34;
        local_240 = uVar37;
        local_238 = (ulong)local_1a8;
        local_230 = (ulong)local_1a4;
        local_228 = (ulong)local_1d8;
        local_220 = (ulong)local_1d4;
      }
      iVar31 = local_1a0 + 1;
    }
  }
  uVar18 = local_318;
  if (((flags & 2) != 0) && ((uint)local_318 != 0)) {
    local_1f0 = (byte *)CONCAT44(local_1f0._4_4_,2 - (uint)((flags & 0x20) == 0));
    uVar25 = 0x80;
    if (local_1b8 < 0x80) {
      uVar25 = local_1b8;
    }
    pbVar15 = (byte *)(ulong)uVar25;
    if ((int)local_1b8 < 1) {
      pbVar15 = (byte *)0x1;
    }
    local_310 = g_bc1_match5_equals_1 + local_1c8 * 3;
    lVar14 = local_1c0 * 3;
    _local_208 = CONCAT44(uStack_204,(int)local_300 * 3);
    local_280 = (byte *)CONCAT44(local_280._4_4_,(int)local_2f8 * 3);
    local_1e8 = (byte *)CONCAT44(local_1e8._4_4_,(int)local_320 * 3);
    local_330 = (byte *)0x3c9;
    if ((flags >> 0xd & 1) == 0) {
      local_330 = pbVar15;
    }
    for (iVar31 = 0; uVar18 = local_318, iVar31 != (int)local_1f0; iVar31 = iVar31 + 1) {
      trial_hb = 0;
      for (lVar16 = 0x18; lVar16 != 0x28; lVar16 = lVar16 + 1) {
        pcVar1 = (char *)((long)&trial_hb + (ulong)results.sels[lVar16 + -0x18]);
        *pcVar1 = *pcVar1 + '\x01';
      }
      uVar9 = hist4::lookup_total_ordering_index((hist4 *)&trial_hb);
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        xh.c[lVar16] = (float)((uint)pPixels[lVar16 * 4 + 2] *
                               (((uint)results.hb >> 2 | results.hb * 8) -
                               ((uint)results.lb >> 2 | results.lb * 8)) * 0x10 +
                               (uint)pPixels[lVar16 * 4 + 1] *
                               (((uint)results.hg >> 4 | results.hg * 4) -
                               ((uint)results.lg >> 4 | results.lg * 4)) * 0x10 +
                               (uint)pPixels[lVar16 * 4] *
                               (((uint)results.hr >> 2 | results.hr * 8) -
                               ((uint)results.lr >> 2 | results.lr * 8)) * 0x10 + (int)lVar16 +
                              0x10000000);
      }
      std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>();
      iVar23 = 0;
      iVar28 = 0;
      fVar32 = 0.0;
      for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
        uVar18 = (ulong)((uint)xh.c[lVar16] & 0xf);
        *(int *)(round_sels + lVar16 * 4) = iVar23;
        *(int *)(trial_sels + lVar16 * 4) = iVar28;
        xl.c[lVar16] = fVar32;
        iVar23 = iVar23 + (uint)pPixels[uVar18 * 4];
        iVar28 = iVar28 + (uint)pPixels[uVar18 * 4 + 1];
        fVar32 = (float)((int)fVar32 + (uint)pPixels[uVar18 * 4 + 2]);
      }
      local_308 = (ulong)uVar9 << 8;
      uVar18 = local_318 & 0xffffffff;
      for (pbVar15 = (byte *)0x0; uVar25 = (uint)uVar18, local_330 != pbVar15; pbVar15 = pbVar15 + 1
          ) {
        if ((flags >> 0xd & 1) == 0) {
          uVar7 = (uint)*(ushort *)(g_best_total_orderings4 + local_308 + (long)pbVar15 * 2);
        }
        else {
          uVar7 = (uint)pbVar15;
        }
        if ((((uVar7 == 0xf) || (uVar7 == 0x203)) || (uVar7 == 0x2f1)) || (uVar7 == 700)) {
          uVar7 = (uint)*local_310;
          uVar22 = (uint)(byte)g_bc1_match6_equals_1[uVar19 * 3];
          uVar27 = (uint)(byte)g_bc1_match5_equals_1[lVar14];
          uVar30 = (uint)local_310[1];
          uVar8 = (uint)(byte)g_bc1_match6_equals_1[uVar19 * 3 + 1];
          uVar39 = (uint)(byte)g_bc1_match5_equals_1[lVar14 + 1];
        }
        else {
          uVar37 = (ulong)uVar7;
          bVar5 = (&g_unique_total_orders4)[uVar37 * 4];
          uVar34 = (ulong)(((uint)(byte)(&DAT_00120201)[uVar37 * 4] + (uint)bVar5) * 4);
          lVar16 = (ulong)bVar5 * 4;
          uVar36 = (ulong)(((uint)(byte)(&DAT_00120202)[uVar37 * 4] +
                           (uint)(byte)(&DAT_00120201)[uVar37 * 4] + (uint)bVar5) * 4);
          uVar22 = ((int)local_300 - *(int *)(round_sels + uVar36)) * 3 +
                   (-*(int *)(round_sels + uVar34) - *(int *)(round_sels + lVar16)) +
                   *(int *)(round_sels + uVar36) * 2;
          uVar27 = ((int)local_2f8 - *(int *)(trial_sels + uVar36)) * 3 +
                   (-*(int *)(trial_sels + uVar34) - *(int *)(trial_sels + lVar16)) +
                   *(int *)(trial_sels + uVar36) * 2;
          iVar23 = *(int *)((long)xl.c + uVar36);
          fVar52 = (float)(local_208 - uVar22);
          uVar7 = ((int)local_320 - iVar23) * 3 +
                  (-*(int *)((long)xl.c + uVar34) - (int)xl.c[bVar5]) + iVar23 * 2;
          fVar50 = (float)((int)local_280 - uVar27);
          fVar48 = (float)((uint)local_1e8 - uVar7);
          fVar53 = (float)uVar22;
          fVar32 = *(float *)((long)&g_selector_factors4 + uVar37 * 0xc);
          fVar49 = *(float *)((long)&g_selector_factors4 + uVar37 * 0xc + 4);
          fVar51 = (float)(&DAT_0016a5b8)[uVar37 * 3];
          fVar54 = (float)uVar27;
          fVar55 = (float)uVar7;
          trial_hr = (int)(fVar32 * fVar53 + fVar49 * fVar52);
          trial_hg = (int)(fVar53 * fVar49 + fVar52 * fVar51);
          fStack_264 = fVar32 * fVar54 + fVar49 * fVar50;
          local_2a0 = fVar54 * fVar49 + fVar50 * fVar51;
          fStack_260 = fVar32 * fVar55 + fVar49 * fVar48;
          local_29c = fVar49 * fVar55 + fVar51 * fVar48;
          precise_round_565((vec3F *)&trial_hr,(vec3F *)&trial_hg,(int *)&local_2f0,
                            (int *)&local_284,(int *)&local_288,(int *)&local_334,(int *)&local_338,
                            (int *)&local_2ec);
          uVar7 = local_334;
          uVar22 = local_338;
          uVar27 = local_2ec;
          uVar30 = local_2f0;
          uVar8 = local_284;
          uVar39 = local_288;
        }
        local_328 = (byte *)CONCAT44(local_328._4_4_,uVar22);
        uVar9 = bc1_find_sels4(flags,(color32 *)pPixels,uVar7,uVar22,uVar27,uVar30,uVar8,uVar39,
                               (uint8_t *)&trial_lb,uVar25);
        if (uVar9 < uVar25) {
          results.lg = (uint32_t)local_328;
          results.lr = uVar7;
          results.hr = uVar30;
          results.lb = uVar27;
          results.hb = uVar39;
          results.hg = uVar8;
          results.sels[0] = (uint8_t)trial_lb;
          results.sels[1] = trial_lb._1_1_;
          results.sels[2] = trial_lb._2_1_;
          results.sels[3] = trial_lb._3_1_;
          results.sels[4] = uStack_254;
          results.sels[5] = uStack_253;
          results.sels[6] = uStack_252;
          results.sels[7] = uStack_251;
          results.sels[8] = auStack_250[0];
          results.sels[9] = auStack_250[1];
          results.sels[10] = auStack_250[2];
          results.sels[0xb] = auStack_250[3];
          results.sels[0xc] = auStack_250[4];
          results.sels[0xd] = auStack_250[5];
          results.sels[0xe] = auStack_250[6];
          results.sels[0xf] = auStack_250[7];
          uVar18 = (ulong)uVar9;
        }
      }
      if ((uVar25 == 0) || (uVar25 == (uint)local_318)) break;
      local_318 = uVar18;
    }
  }
  local_318 = uVar18;
  if (((flags & 0x18) != 0) && ((uint)local_318 != 0)) {
    if ((flags & 0x10) != 0) {
      uVar9 = bc1_find_sels3_fullerr
                        (false,(color32 *)pPixels,(uint32_t)local_220,(uint32_t)local_228,
                         (uint32_t)local_230,(uint32_t)local_238,(uint32_t)local_240,
                         (uint32_t)local_248,(uint8_t *)&trial_lb,0xffffffff);
      if (uVar9 == 0) {
        uVar9 = 0;
      }
      else {
        lVar14 = local_1c8 * 3;
        local_310 = g_bc1_match6_half + uVar19 * 3;
        lVar16 = local_1c0 * 3;
        iVar31 = 2 - (uint)((flags & 4) == 0);
        while( true ) {
          if (iVar31 == 0) break;
          bVar47 = compute_least_squares_endpoints3_rgb
                             (false,(color32 *)pPixels,(uint8_t *)&trial_lb,(vec3F *)trial_sels,&xl)
          ;
          if (bVar47) {
            precise_round_565((vec3F *)trial_sels,&xl,&trial_hb,(int *)&local_334,(int *)&local_338,
                              (int *)&xh,&trial_hr,&trial_hg);
            uVar37 = (ulong)(uint)trial_hg;
            uVar19 = (ulong)(uint)trial_hb;
            uVar18 = (ulong)local_334;
            uVar34 = (ulong)local_338;
            fVar32 = xh.c[0];
            uVar25 = trial_hr;
          }
          else {
            fVar32 = (float)(uint)(byte)g_bc1_match5_half[lVar14];
            uVar25 = (uint)*local_310;
            uVar37 = (ulong)(byte)g_bc1_match5_half[lVar16];
            uVar19 = (ulong)(byte)g_bc1_match5_half[lVar14 + 1];
            uVar18 = (ulong)local_310[1];
            uVar34 = (ulong)(byte)g_bc1_match5_half[lVar16 + 1];
          }
          if (((((float)local_220 == fVar32) && ((uint)local_228 == uVar25)) &&
              ((uint32_t)local_230 == (uint32_t)uVar37)) &&
             ((((uint32_t)local_238 == (uint32_t)uVar19 && ((uint32_t)local_240 == (uint32_t)uVar18)
               ) && ((uint32_t)local_248 == (uint32_t)uVar34)))) break;
          local_328 = (byte *)CONCAT44(local_328._4_4_,iVar31 + -1);
          local_330 = (byte *)CONCAT44(local_330._4_4_,fVar32);
          uVar10 = bc1_find_sels3_fullerr
                             (false,(color32 *)pPixels,(uint32_t)fVar32,uVar25,(uint32_t)uVar37,
                              (uint32_t)uVar19,(uint32_t)uVar18,(uint32_t)uVar34,round_sels,uVar9);
          if (uVar9 <= uVar10) break;
          trial_lb._0_1_ = round_sels[0];
          trial_lb._1_1_ = round_sels[1];
          trial_lb._2_1_ = round_sels[2];
          trial_lb._3_1_ = round_sels[3];
          uStack_254 = round_sels[4];
          uStack_253 = round_sels[5];
          uStack_252 = round_sels[6];
          uStack_251 = round_sels[7];
          auStack_250[0] = round_sels[8];
          auStack_250[1] = round_sels[9];
          auStack_250[2] = round_sels[10];
          auStack_250[3] = round_sels[0xb];
          auStack_250[4] = round_sels[0xc];
          auStack_250[5] = round_sels[0xd];
          auStack_250[6] = round_sels[0xe];
          auStack_250[7] = round_sels[0xf];
          local_248 = uVar34;
          local_240 = uVar18;
          local_238 = uVar19;
          local_230 = uVar37;
          local_228 = (ulong)uVar25;
          local_220 = (ulong)local_330 & 0xffffffff;
          iVar31 = (uint32_t)local_328;
          uVar9 = uVar10;
        }
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else if (local_1dc != 0 && (flags & 2) != 0) {
          _h_1 = _h_1 & 0xff000000;
          for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
            h_1.m_hist[*(byte *)((long)&trial_lb + lVar17)] =
                 h_1.m_hist[*(byte *)((long)&trial_lb + lVar17)] + '\x01';
          }
          uVar10 = hist3::lookup_total_ordering_index(&h_1);
          for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
            xh.c[lVar17] = (float)((uint)pPixels[lVar17 * 4 + 2] *
                                   (((uint)(local_248 >> 2) & 0x3fffffff | (int)local_248 * 8) -
                                   ((uint)(local_230 >> 2) & 0x3fffffff | (int)local_230 * 8)) *
                                   0x10 + (uint)pPixels[lVar17 * 4 + 1] *
                                          (((uint)(local_240 >> 4) & 0xfffffff | (int)local_240 * 4)
                                          - ((uint)(local_228 >> 4) & 0xfffffff | (int)local_228 * 4
                                            )) * 0x10 +
                                          (uint)pPixels[lVar17 * 4] *
                                          (((uint)(local_238 >> 2) & 0x3fffffff | (int)local_238 * 8
                                           ) - ((uint)(local_220 >> 2) & 0x3fffffff |
                                               (int)local_220 * 8)) * 0x10 + (int)lVar17 +
                                  0x10000000);
          }
          std::__sort<int*,__gnu_cxx::__ops::_Iter_less_iter>(&xh);
          iVar31 = 0;
          iVar23 = 0;
          fVar32 = 0.0;
          for (lVar17 = 0; lVar17 != 0x10; lVar17 = lVar17 + 1) {
            uVar19 = (ulong)((uint)xh.c[lVar17] & 0xf);
            *(int *)(round_sels + lVar17 * 4) = iVar31;
            *(int *)(trial_sels + lVar17 * 4) = iVar23;
            xl.c[lVar17] = fVar32;
            iVar31 = iVar31 + (uint)pPixels[uVar19 * 4];
            iVar23 = iVar23 + (uint)pPixels[uVar19 * 4 + 1];
            fVar32 = (float)((int)fVar32 + (uint)pPixels[uVar19 * 4 + 2]);
          }
          uVar25 = 0x20;
          if (local_1dc < 0x20) {
            uVar25 = local_1dc;
          }
          local_330 = (byte *)0x99;
          if ((flags >> 0xd & 1) == 0) {
            local_330 = (byte *)(ulong)uVar25;
          }
          local_308 = CONCAT44(local_308._4_4_,(int)local_300 * 2);
          _local_208 = CONCAT44(uStack_204,(int)local_2f8 * 2);
          local_280 = (byte *)CONCAT44(local_280._4_4_,(int)local_320 * 2);
          pbVar15 = (byte *)0x0;
          while (local_330 != pbVar15) {
            if ((flags >> 0xd & 1) == 0) {
              uVar25 = (uint)pbVar15[(ulong)uVar10 * 0x20 + 0x15dda0];
            }
            else {
              uVar25 = (uint)pbVar15;
            }
            local_328 = pbVar15;
            if (((uVar25 == 0xc) || (uVar25 == 0x59)) || (uVar25 == 0xf)) {
              uVar18 = (ulong)(byte)g_bc1_match5_half[lVar14];
              uVar37 = (ulong)(byte)g_bc1_match5_half[lVar16];
              uVar19 = (ulong)(byte)g_bc1_match5_half[lVar14 + 1];
              uVar36 = (ulong)local_310[1];
              uVar34 = (ulong)(byte)g_bc1_match5_half[lVar16 + 1];
              uVar25 = (uint)*local_310;
            }
            else {
              uVar19 = (ulong)uVar25;
              bVar5 = (&g_unique_total_orders3)[uVar19 * 3];
              uVar18 = (ulong)(((uint)(byte)(&DAT_00121132)[uVar19 * 3] + (uint)bVar5) * 4);
              lVar17 = (ulong)bVar5 * 4;
              uVar25 = (-*(int *)(round_sels + uVar18) - *(int *)(round_sels + lVar17)) +
                       (int)local_300 * 2;
              uVar7 = (-*(int *)(trial_sels + uVar18) - *(int *)(trial_sels + lVar17)) +
                      (int)local_2f8 * 2;
              fVar52 = (float)((uint32_t)local_308 - uVar25);
              fVar32 = *(float *)((long)&g_selector_factors3 + uVar19 * 0xc);
              uVar22 = (-*(int *)((long)xl.c + uVar18) - (int)xl.c[bVar5]) + (int)local_320 * 2;
              fVar50 = (float)(local_208 - uVar7);
              fVar48 = (float)((int)local_280 - uVar22);
              fVar49 = *(float *)((long)&g_selector_factors3 + uVar19 * 0xc + 4);
              fVar53 = (float)uVar25;
              fVar51 = (float)(&DAT_0016d528)[uVar19 * 3];
              trial_hg = (int)(fVar32 * fVar53 + fVar49 * fVar52);
              fVar54 = (float)uVar7;
              trial_hb = (int)(fVar53 * fVar49 + fVar52 * fVar51);
              local_2a0 = fVar32 * fVar54 + fVar49 * fVar50;
              local_294 = fVar54 * fVar49 + fVar50 * fVar51;
              fVar50 = (float)uVar22;
              local_29c = fVar32 * fVar50 + fVar49 * fVar48;
              local_290 = fVar49 * fVar50 + fVar51 * fVar48;
              precise_round_565((vec3F *)&trial_hg,(vec3F *)&trial_hb,(int *)&local_2f0,
                                (int *)&local_284,(int *)&local_288,(int *)&local_334,
                                (int *)&local_338,(int *)&local_2ec);
              uVar18 = (ulong)local_334;
              uVar37 = (ulong)local_2ec;
              uVar19 = (ulong)local_2f0;
              uVar36 = (ulong)local_284;
              uVar34 = (ulong)local_288;
              uVar25 = local_338;
            }
            uVar12 = bc1_find_sels3_fullerr
                               (false,(color32 *)pPixels,(uint32_t)uVar18,uVar25,(uint32_t)uVar37,
                                (uint32_t)uVar19,(uint32_t)uVar36,(uint32_t)uVar34,
                                (uint8_t *)&trial_hr,0xffffffff);
            if (uVar12 < uVar9) {
              trial_lb._0_1_ = (uint8_t)trial_hr;
              trial_lb._1_1_ = (uint8_t)((uint)trial_hr >> 8);
              trial_lb._2_1_ = (uint8_t)((uint)trial_hr >> 0x10);
              trial_lb._3_1_ = (uint8_t)((uint)trial_hr >> 0x18);
              uStack_254 = SUB41(fStack_264,0);
              uStack_253 = (uint8_t)((uint)fStack_264 >> 8);
              uStack_252 = (uint8_t)((uint)fStack_264 >> 0x10);
              uStack_251 = (uint8_t)((uint)fStack_264 >> 0x18);
              auStack_250[0] = SUB41(fStack_260,0);
              auStack_250[1] = (uint8_t)((uint)fStack_260 >> 8);
              auStack_250[2] = (uint8_t)((uint)fStack_260 >> 0x10);
              auStack_250[3] = (uint8_t)((uint)fStack_260 >> 0x18);
              auStack_250[4] = (uint8_t)uStack_25c;
              auStack_250[5] = (uint8_t)((uint)uStack_25c >> 8);
              auStack_250[6] = (uint8_t)((uint)uStack_25c >> 0x10);
              auStack_250[7] = (uint8_t)((uint)uStack_25c >> 0x18);
              local_248 = uVar34;
              local_240 = uVar36;
              local_238 = uVar19;
              local_230 = uVar37;
              local_228 = (ulong)uVar25;
              local_220 = uVar18;
              uVar9 = uVar12;
            }
            pbVar15 = local_328 + 1;
          }
        }
      }
      if (uVar9 < (uint)local_318) {
        results.m_3color = true;
        results.lg = (int)local_228;
        results.lr = (int)local_220;
        results.hr = (int)local_238;
        results.lb = (int)local_230;
        results.hb = (int)local_248;
        results.hg = (int)local_240;
        results.sels[0] = (uint8_t)trial_lb;
        results.sels[1] = trial_lb._1_1_;
        results.sels[2] = trial_lb._2_1_;
        results.sels[3] = trial_lb._3_1_;
        results.sels[4] = uStack_254;
        results.sels[5] = uStack_253;
        results.sels[6] = uStack_252;
        results.sels[7] = uStack_251;
        results.sels[8] = auStack_250[0];
        results.sels[9] = auStack_250[1];
        results.sels[10] = auStack_250[2];
        results.sels[0xb] = auStack_250[3];
        results.sels[0xc] = auStack_250[4];
        results.sels[0xd] = auStack_250[5];
        results.sels[0xe] = auStack_250[6];
        results.sels[0xf] = auStack_250[7];
        local_318 = (ulong)uVar9;
      }
    }
    if (((flags & 8) != 0) && (local_278 != 0)) {
      uVar27 = 0xff;
      uVar30 = 0xff;
      uVar8 = 0xff;
      uVar22 = 0;
      uVar7 = 0;
      uVar25 = 0;
      iVar23 = 0;
      iVar28 = 0;
      iVar33 = 0;
      iVar31 = 0;
      for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
        bVar5 = pPixels[lVar14 * 4];
        bVar2 = pPixels[lVar14 * 4 + 1];
        bVar3 = pPixels[lVar14 * 4 + 2];
        if (3 < (byte)(bVar2 | bVar5 | bVar3)) {
          uVar39 = (uint)bVar5;
          if (uVar25 <= uVar39) {
            uVar25 = uVar39;
          }
          uVar45 = (uint)bVar2;
          if (uVar7 <= uVar45) {
            uVar7 = uVar45;
          }
          uVar41 = (uint)bVar3;
          if (uVar22 <= uVar41) {
            uVar22 = uVar41;
          }
          if (uVar39 <= uVar27) {
            uVar27 = (uint)bVar5;
          }
          if (uVar45 <= uVar30) {
            uVar30 = (uint)bVar2;
          }
          if (uVar41 <= uVar8) {
            uVar8 = (uint)bVar3;
          }
          iVar31 = iVar31 + (uint)bVar5;
          iVar33 = iVar33 + (uint)bVar2;
          iVar28 = iVar28 + (uint)bVar3;
          iVar23 = iVar23 + 1;
        }
      }
      if (iVar23 != 0) {
        iVar42 = iVar23 >> 1;
        iVar31 = (iVar31 + iVar42) / iVar23;
        iVar33 = (iVar33 + iVar42) / iVar23;
        local_328 = (byte *)CONCAT44(local_328._4_4_,iVar33);
        iVar23 = (iVar28 + iVar42) / iVar23;
        local_330 = (byte *)CONCAT44(local_330._4_4_,iVar23);
        iVar42 = 0;
        iVar28 = 0;
        iVar35 = 0;
        iVar46 = 0;
        iVar43 = 0;
        for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
          if (3 < (byte)(pPixels[lVar14 * 4 + 1] | pPixels[lVar14 * 4] | pPixels[lVar14 * 4 + 2])) {
            iVar11 = (uint)pPixels[lVar14 * 4] - iVar31;
            iVar24 = (uint)pPixels[lVar14 * 4 + 1] - iVar33;
            iVar40 = (uint)pPixels[lVar14 * 4 + 2] - iVar23;
            iVar43 = iVar43 + iVar11 * iVar11;
            iVar46 = iVar46 + iVar24 * iVar11;
            iVar35 = iVar35 + iVar11 * iVar40;
            iVar28 = iVar28 + iVar24 * iVar24;
            iVar42 = iVar42 + iVar40 * iVar24;
          }
        }
        round_sels[0xc] = (char)iVar28;
        round_sels[0xd] = (char)((uint)iVar28 >> 8);
        round_sels[0xe] = (char)((uint)iVar28 >> 0x10);
        round_sels[0xf] = (char)((uint)iVar28 >> 0x18);
        round_sels[8] = (char)iVar35;
        round_sels[9] = (char)((uint)iVar35 >> 8);
        round_sels[10] = (char)((uint)iVar35 >> 0x10);
        round_sels[0xb] = (char)((uint)iVar35 >> 0x18);
        round_sels[4] = (char)iVar46;
        round_sels[5] = (char)((uint)iVar46 >> 8);
        round_sels[6] = (char)((uint)iVar46 >> 0x10);
        round_sels[7] = (char)((uint)iVar46 >> 0x18);
        round_sels[0] = (char)iVar43;
        round_sels[1] = (char)((uint)iVar43 >> 8);
        round_sels[2] = (char)((uint)iVar43 >> 0x10);
        round_sels[3] = (char)((uint)iVar43 >> 0x18);
        for (lVar14 = 0; lVar14 != 6; lVar14 = lVar14 + 1) {
          *(float *)(trial_sels + lVar14 * 4) =
               (float)*(int *)(round_sels + lVar14 * 4) * 0.003921569;
        }
        fVar32 = (float)(int)(uVar25 - uVar27);
        if (iVar35 < 0) {
          fVar32 = -fVar32;
        }
        fVar49 = (float)(int)(uVar7 - uVar30);
        fVar51 = (float)(int)(uVar22 - uVar8);
        if (iVar42 < 0) {
          fVar49 = -fVar49;
        }
        iVar23 = 4;
        while (bVar47 = iVar23 != 0, iVar23 = iVar23 + -1, bVar47) {
          fVar50 = (float)trial_sels._4_4_ * fVar49;
          fVar52 = fVar51 * (float)trial_sels._8_4_;
          fVar48 = fVar49 * (float)local_c8;
          fVar49 = fVar51 * (float)local_c8 +
                   fVar32 * (float)trial_sels._4_4_ + fVar49 * (float)trial_sels._12_4_;
          fVar51 = fVar51 * (float)((ulong)local_c8 >> 0x20) +
                   fVar32 * (float)trial_sels._8_4_ + fVar48;
          fVar32 = fVar52 + fVar32 * (float)trial_sels._0_4_ + fVar50;
        }
        fVar48 = ABS(fVar32);
        if (ABS(fVar32) <= ABS(fVar49)) {
          fVar48 = ABS(fVar49);
        }
        if (fVar48 <= ABS(fVar51)) {
          fVar48 = ABS(fVar51);
        }
        if (2.0 <= fVar48) {
          fVar48 = 1024.0 / fVar48;
          iVar23 = (int)(fVar32 * fVar48);
          iVar28 = (int)(fVar49 * fVar48);
          iVar33 = (int)(fVar51 * fVar48);
        }
        else {
          iVar28 = 0x259;
          iVar33 = 0x75;
          iVar23 = 0x132;
        }
        iVar35 = -0x80000000;
        iVar42 = 0x7fffffff;
        uVar18 = 0;
        uVar19 = 0;
        for (uVar37 = 0; uVar37 != 0x10; uVar37 = uVar37 + 1) {
          if (3 < (byte)(pPixels[uVar37 * 4 + 1] | pPixels[uVar37 * 4] | pPixels[uVar37 * 4 + 2])) {
            iVar43 = (uint)pPixels[uVar37 * 4 + 2] * iVar33 +
                     (uint)pPixels[uVar37 * 4 + 1] * iVar28 + (uint)pPixels[uVar37 * 4] * iVar23;
            if (iVar43 < iVar42) {
              uVar19 = uVar37 & 0xffffffff;
              iVar42 = iVar43;
            }
            if (iVar35 < iVar43) {
              uVar18 = uVar37 & 0xffffffff;
              iVar35 = iVar43;
            }
          }
        }
        local_340 = ((uint)pPixels[uVar19 * 4] * 0x1f + 0x80 >> 8) +
                    (uint)pPixels[uVar19 * 4] * 0x1f + 0x80 >> 8;
        uVar25 = ((uint)pPixels[uVar19 * 4 + 1] * 0x3f + 0x80 >> 8) +
                 (uint)pPixels[uVar19 * 4 + 1] * 0x3f + 0x80 >> 8;
        local_2b8 = (uint)pPixels[uVar19 * 4 + 2] * 0x1f +
                    ((uint)pPixels[uVar19 * 4 + 2] * 0x1f + 0x80 >> 8) + 0x80 >> 8;
        local_2b0 = (uint)pPixels[uVar18 * 4] * 0x1f +
                    ((uint)pPixels[uVar18 * 4] * 0x1f + 0x80 >> 8) + 0x80 >> 8;
        uVar22 = (uint)pPixels[uVar18 * 4 + 1] * 0x3f +
                 ((uint)pPixels[uVar18 * 4 + 1] * 0x3f + 0x80 >> 8) + 0x80 >> 8;
        local_308 = (ulong)uVar22;
        uVar7 = ((uint)pPixels[uVar18 * 4 + 2] * 0x1f + 0x80 >> 8) +
                (uint)pPixels[uVar18 * 4 + 2] * 0x1f + 0x80 >> 8;
        local_320 = (ulong)uVar7;
        local_310 = (byte *)CONCAT44(local_310._4_4_,uVar25);
        uVar9 = bc1_find_sels3_fullerr
                          (true,(color32 *)pPixels,local_340,uVar25,local_2b8,local_2b0,uVar22,uVar7
                           ,(uint8_t *)&xl,0xffffffff);
        if (uVar9 == 0) {
          uVar9 = 0;
        }
        else {
          local_200 = local_200 - (uint)((flags & 4) == 0);
          local_2f8 = g_bc1_match5_half + (long)iVar31 * 3;
          local_300 = g_bc1_match6_half + (long)(int)(uint32_t)local_328 * 3;
          local_330 = g_bc1_match5_half + (long)(int)(uint32_t)local_330 * 3;
          while( true ) {
            if (local_200 == 0) break;
            local_200 = local_200 + -1;
            bVar47 = compute_least_squares_endpoints3_rgb
                               (true,(color32 *)pPixels,(uint8_t *)&xl,(vec3F *)&trial_lb,
                                (vec3F *)&trial_hr);
            if (bVar47) {
              precise_round_565((vec3F *)&trial_lb,(vec3F *)&trial_hr,(int *)&local_338,
                                (int *)&local_2ec,(int *)&local_2f0,&trial_hg,&trial_hb,
                                (int *)&local_334);
              uVar19 = (ulong)local_2ec;
              uVar18 = (ulong)local_2f0;
              uVar10 = trial_hg;
              uVar12 = trial_hb;
              uVar25 = local_334;
              uVar7 = local_338;
            }
            else {
              uVar10 = (uint32_t)*local_2f8;
              uVar12 = (uint32_t)*local_300;
              uVar25 = (uint)*local_330;
              uVar7 = (uint)local_2f8[1];
              uVar19 = (ulong)local_300[1];
              uVar18 = (ulong)local_330[1];
            }
            if ((((local_340 == uVar10) && ((uint32_t)local_310 == uVar12)) && (local_2b8 == uVar25)
                ) && (((local_2b0 == uVar7 && ((uint32_t)local_308 == (uint32_t)uVar19)) &&
                      ((uint32_t)local_320 == (uint32_t)uVar18)))) break;
            local_328 = (byte *)CONCAT44(local_328._4_4_,uVar12);
            uVar12 = bc1_find_sels3_fullerr
                               (true,(color32 *)pPixels,uVar10,uVar12,uVar25,uVar7,(uint32_t)uVar19,
                                (uint32_t)uVar18,(uint8_t *)&xh,uVar9);
            if (uVar9 <= uVar12) break;
            xl.c[1] = xh.c[1];
            xl.c[0] = xh.c[0];
            xl.c[2]._0_1_ = xh.c[2]._0_1_;
            xl.c[2]._1_1_ = xh.c[2]._1_1_;
            xl.c[2]._2_1_ = xh.c[2]._2_1_;
            xl.c[2]._3_1_ = xh.c[2]._3_1_;
            uStack_11c = uStack_7c;
            uStack_11b = uStack_7b;
            uStack_11a = uStack_7a;
            uStack_119 = uStack_79;
            local_310 = (byte *)CONCAT44(local_310._4_4_,(uint32_t)local_328);
            uVar9 = uVar12;
            local_320 = uVar18;
            local_308 = uVar19;
            local_340 = uVar10;
            local_2b8 = uVar25;
            local_2b0 = uVar7;
          }
        }
        if (uVar9 < (uint)local_318) {
          results.m_3color = true;
          results.lg = (uint32_t)local_310;
          results.lr = local_340;
          results.hr = local_2b0;
          results.lb = local_2b8;
          results.hb = (int)local_320;
          results.hg = (int)local_308;
          results.sels._0_8_ = xl.c._0_8_;
          results.sels[8] = xl.c[2]._0_1_;
          results.sels[9] = xl.c[2]._1_1_;
          results.sels[10] = xl.c[2]._2_1_;
          results.sels[0xb] = xl.c[2]._3_1_;
          results.sels[0xc] = uStack_11c;
          results.sels[0xd] = uStack_11b;
          results.sels[0xe] = uStack_11a;
          results.sels[0xf] = uStack_119;
          local_318 = (ulong)uVar9;
        }
      }
    }
  }
  local_280 = (byte *)CONCAT71(local_280._1_7_,results.m_3color);
  if ((0x3fffff < flags) && ((uint)local_318 != 0)) {
    uVar25 = 0xffffffff;
    uVar7 = flags >> 0x16;
    local_308 = CONCAT44(local_308._4_4_,results.lr);
    local_2b0 = results.lg;
    local_2b8 = results.lb;
    local_310 = (byte *)CONCAT44(local_310._4_4_,results.hr);
    local_340 = results.hg;
    local_330 = (byte *)CONCAT44(local_330._4_4_,results.hb);
    local_1f0 = (byte *)CONCAT71(local_1f0._1_7_,(byte)flags >> 3 & local_278 != 0);
    local_320 = local_320 & 0xffffffff00000000;
    local_1e8 = (byte *)CONCAT44(local_1e8._4_4_,uVar7);
    for (uVar22 = 0; uVar19 = local_318, uVar9 = 0x1f, uVar7 != uVar22; uVar22 = uVar22 + 1) {
      if (uVar25 != (uVar22 & 0x1f)) {
        uVar18 = (ulong)(uVar22 & 0xf);
        local_2f8 = (byte *)(CONCAT44(local_2f8._4_4_,uVar22) & 0xffffffff00000010);
        if ((uVar22 & 0x10) == 0) {
          uVar44 = (int)(char)s_adjacent_voxels[uVar18 * 4] + (uint32_t)local_310;
          if (0x1e < (int)uVar44) {
            uVar44 = uVar9;
          }
          if ((int)uVar44 < 1) {
            uVar44 = 0;
          }
          local_208 = (int)(char)s_adjacent_voxels[uVar18 * 4 + 1] + local_340;
          if (0x3e < (int)local_208) {
            local_208 = 0x3f;
          }
          if ((int)local_208 < 1) {
            local_208 = 0;
          }
          local_348 = (int)(char)s_adjacent_voxels[uVar18 * 4 + 2] + (uint32_t)local_330;
          if (0x1e < (int)local_348) {
            local_348 = uVar9;
          }
          uVar10 = (uint32_t)local_308;
          uVar38 = local_2b8;
          uVar12 = local_2b0;
          if ((int)local_348 < 1) {
            local_348 = 0;
          }
        }
        else {
          uVar10 = (int)(char)s_adjacent_voxels[uVar18 * 4] + (uint32_t)local_308;
          if (0x1e < (int)uVar10) {
            uVar10 = uVar9;
          }
          if ((int)uVar10 < 1) {
            uVar10 = 0;
          }
          uVar12 = (int)(char)s_adjacent_voxels[uVar18 * 4 + 1] + local_2b0;
          if (0x3e < (int)uVar12) {
            uVar12 = 0x3f;
          }
          if ((int)uVar12 < 1) {
            uVar12 = 0;
          }
          uVar38 = (int)(char)s_adjacent_voxels[uVar18 * 4 + 2] + local_2b8;
          if (0x1e < (int)uVar38) {
            uVar38 = uVar9;
          }
          uVar44 = (uint32_t)local_310;
          local_208 = local_340;
          local_348 = (uint32_t)local_330;
          if ((int)uVar38 < 1) {
            uVar38 = 0;
          }
        }
        uStack_204 = 0;
        local_328 = (byte *)CONCAT44(local_328._4_4_,uVar25);
        local_300 = (byte *)CONCAT44(local_300._4_4_,uVar44);
        uVar7 = (uint)local_318;
        if (((ulong)local_280 & 1) == 0) {
          uVar27 = bc1_find_sels4(flags,(color32 *)pPixels,uVar10,uVar12,uVar38,uVar44,local_208,
                                  local_348,round_sels,uVar7);
        }
        else {
          uVar27 = bc1_find_sels3_fullerr
                             (local_1f0._0_1_,(color32 *)pPixels,uVar10,uVar12,uVar38,uVar44,
                              local_208,local_348,round_sels,uVar7);
        }
        uVar25 = (uint32_t)local_328;
        if (uVar27 < uVar7) {
          uVar25 = (uint)local_2f8 | (int)(char)s_adjacent_voxels[uVar18 * 4 + 3];
          results.lg = uVar12;
          results.lr = uVar10;
          results.hr = (int)local_300;
          results.lb = uVar38;
          local_340 = local_208;
          results.hb = local_348;
          results.hg = local_208;
          results.sels[0] = round_sels[0];
          results.sels[1] = round_sels[1];
          results.sels[2] = round_sels[2];
          results.sels[3] = round_sels[3];
          results.sels[4] = round_sels[4];
          results.sels[5] = round_sels[5];
          results.sels[6] = round_sels[6];
          results.sels[7] = round_sels[7];
          results.sels[8] = round_sels[8];
          results.sels[9] = round_sels[9];
          results.sels[10] = round_sels[10];
          results.sels[0xb] = round_sels[0xb];
          results.sels[0xc] = round_sels[0xc];
          results.sels[0xd] = round_sels[0xd];
          results.sels[0xe] = round_sels[0xe];
          results.sels[0xf] = round_sels[0xf];
          local_330 = (byte *)CONCAT44(local_330._4_4_,local_348);
          local_310 = (byte *)CONCAT44(local_310._4_4_,(int)local_300);
          local_308 = CONCAT44(local_308._4_4_,uVar10);
          local_320 = CONCAT44(local_320._4_4_,uVar22);
          uVar19 = (ulong)uVar27;
          local_2b8 = uVar38;
          local_2b0 = uVar12;
        }
        uVar7 = (uint)local_1e8;
        local_318 = uVar19;
        if (0x20 < (int)(uVar22 - (uint32_t)local_320)) break;
      }
    }
  }
  if (((ulong)local_280 & 1) == 0) {
    uVar7 = results.lr << 0xb | results.lb | results.lg << 5;
    uVar25 = uVar7 & 0xffff;
    sVar6 = (short)uVar7;
    uVar7 = results.hr << 0xb | results.hb | results.hg << 5;
    uVar22 = uVar7 & 0xffff;
    sVar21 = (short)uVar7;
    if (uVar25 != uVar22) {
      sVar29 = sVar21;
      if (uVar25 >= uVar22 && uVar25 != uVar22) {
        sVar29 = sVar6;
      }
      if (uVar25 < uVar22) {
        sVar21 = sVar6;
      }
      *local_1d0 = (char)sVar29;
      local_1d0[1] = (char)((ushort)sVar29 >> 8);
      local_1d0[2] = (char)sVar21;
      local_1d0[3] = (char)((ushort)sVar21 >> 8);
      uVar7 = 0;
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 2) {
        uVar7 = uVar7 | (uint)*(byte *)((long)&bc1_encode4(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                               ::s_sel_trans + (ulong)*local_1f8) <<
                        ((byte)lVar14 & 0x1f);
        local_1f8 = local_1f8 + 1;
      }
      bVar5 = 0x55;
      if (uVar22 <= uVar25) {
        bVar5 = 0;
      }
      local_1d0[4] = (byte)uVar7 ^ bVar5;
      local_1d0[5] = (byte)(uVar7 >> 8) ^ bVar5;
      local_1d0[6] = (byte)(uVar7 >> 0x10) ^ bVar5;
      local_1d0[7] = (byte)(uVar7 >> 0x18) ^ bVar5;
    }
    else {
      bVar47 = uVar25 == 0;
      sVar29 = sVar6;
      if (bVar47) {
        sVar29 = 1;
      }
      *local_1d0 = (char)sVar29;
      local_1d0[1] = (char)((ushort)sVar29 >> 8);
      sVar21 = sVar21 + -1;
      if (bVar47) {
        sVar21 = sVar6;
      }
      local_1d0[2] = (char)sVar21;
      local_1d0[3] = (char)((ushort)sVar21 >> 8);
      uVar13 = 0x55555555;
      if (!bVar47) {
        uVar13 = 0;
      }
      *(undefined4 *)(local_1d0 + 4) = uVar13;
    }
  }
  else {
    uVar25 = results.lr << 0xb | results.lb | results.lg << 5;
    uVar7 = results.hr << 0xb | results.hb | results.hg << 5;
    uVar26 = (undefined1)(uVar7 >> 8);
    uVar20 = (undefined1)(uVar25 >> 8);
    if ((uVar7 & 0xffff) < (uVar25 & 0xffff)) {
      *local_1d0 = (char)uVar7;
      local_1d0[1] = uVar26;
      local_1d0[2] = (char)uVar25;
      local_1d0[3] = uVar20;
      uVar25 = 0;
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 2) {
        uVar25 = uVar25 | (uint)*(byte *)((long)&bc1_encode3(rgbcx::bc1_block*,int,int,int,int,int,int,unsigned_char_const*)
                                                 ::s_sel_trans_inv + (ulong)*local_1f8) <<
                          ((byte)lVar14 & 0x1f);
        local_1f8 = local_1f8 + 1;
      }
    }
    else {
      *local_1d0 = (char)uVar25;
      local_1d0[1] = uVar20;
      local_1d0[2] = (char)uVar7;
      local_1d0[3] = uVar26;
      uVar25 = 0;
      for (lVar14 = 0; lVar14 != 0x20; lVar14 = lVar14 + 2) {
        uVar25 = uVar25 | (uint)*local_1f8 << ((byte)lVar14 & 0x1f);
        local_1f8 = local_1f8 + 1;
      }
    }
    *(uint *)(local_1d0 + 4) = uVar25;
  }
  return;
}

Assistant:

void encode_bc1(void* pDst, const uint8_t* pPixels, uint32_t flags, uint32_t total_orderings_to_try, uint32_t total_orderings_to_try3)
	{
		assert(g_initialized);
				
		const color32* pSrc_pixels = (const color32*)pPixels;
		bc1_block* pDst_block = static_cast<bc1_block*>(pDst);
		
		int avg_r, avg_g, avg_b, min_r, min_g, min_b, max_r, max_g, max_b;
						
		const uint32_t fr = pSrc_pixels[0].r, fg = pSrc_pixels[0].g, fb = pSrc_pixels[0].b;

		uint32_t j;
		for (j = 15; j >= 1; --j)
			if ((pSrc_pixels[j].r != fr) || (pSrc_pixels[j].g != fg) || (pSrc_pixels[j].b != fb))
				break;

		if (j == 0)
		{
			encode_bc1_solid_block(pDst, fr, fg, fb, (flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0);
			return;
		}

		int total_r = fr, total_g = fg, total_b = fb;
		
		max_r = fr, max_g = fg, max_b = fb;
		min_r = fr, min_g = fg, min_b = fb;
		
		uint32_t grayscale_flag = (fr == fg) && (fr == fb);
		uint32_t any_black_pixels = (fr | fg | fb) < 4;

		for (uint32_t i = 1; i < 16; i++)
		{
			const int r = pSrc_pixels[i].r, g = pSrc_pixels[i].g, b = pSrc_pixels[i].b;
			
			grayscale_flag &= ((r == g) && (r == b));
			any_black_pixels |= ((r | g | b) < 4);

			max_r = std::max(max_r, r); max_g = std::max(max_g, g); max_b = std::max(max_b, b);
			min_r = std::min(min_r, r); min_g = std::min(min_g, g); min_b = std::min(min_b, b);
			total_r += r; total_g += g; total_b += b;
		}

		avg_r = (total_r + 8) >> 4, avg_g = (total_g + 8) >> 4, avg_b = (total_b + 8) >> 4;

		bc1_encode_results results;
		results.m_3color = false;

		uint8_t *sels = results.sels;
		int &lr = results.lr, &lg = results.lg, &lb = results.lb, &hr = results.hr, &hg = results.hg, &hb = results.hb;
		int orig_lr = 0, orig_lg = 0, orig_lb = 0, orig_hr = 0, orig_hg = 0, orig_hb = 0;

		lr = 0, lg = 0, lb = 0, hr = 0, hg = 0, hb = 0;
								
		const bool needs_block_error = ((flags & (cEncodeBC1UseLikelyTotalOrderings | cEncodeBC1Use3ColorBlocks | cEncodeBC1UseFullMSEEval | cEncodeBC1EndpointSearchRoundsMask)) != 0) ||
				(any_black_pixels && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0));
		
		uint32_t cur_err = UINT32_MAX;

		if (!needs_block_error)
		{
			assert((flags & cEncodeBC1TryAllInitialEndponts) == 0);

			encode_bc1_pick_initial(pSrc_pixels, flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					lr, lg, lb, hr, hg, hb);

			orig_lr = lr, orig_lg = lg, orig_lb = lb, orig_hr = hr, orig_hg = hg, orig_hb = hb;

			bc1_find_sels4_noerr(pSrc_pixels, lr, lg, lb, hr, hg, hb, sels);

			const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
			for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
			{
				int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

				vec3F xl, xh;
				if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, sels, &xl, &xh, total_r, total_g, total_b))
				{
					// All selectors equal - treat it as a solid block which should always be equal or better.
					trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
					trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
					trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

					trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
					trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
					trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

					// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
				}
				else
				{
					precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
				}

				if ((lr == trial_lr) && (lg == trial_lg) && (lb == trial_lb) && (hr == trial_hr) && (hg == trial_hg) && (hb == trial_hb))
					break;
			
				bc1_find_sels4_noerr(pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, sels);

				lr = trial_lr;
				lg = trial_lg;
				lb = trial_lb;
				hr = trial_hr;
				hg = trial_hg;
				hb = trial_hb;

			} // ls_pass
		}
		else
		{
			const uint32_t total_rounds = (flags & cEncodeBC1TryAllInitialEndponts) ? 2 : 1;
			for (uint32_t round = 0; round < total_rounds; round++)
			{
				uint32_t modified_flags = flags;
				if (round == 1)
				{
					modified_flags &= ~(cEncodeBC1Use2DLS | cEncodeBC1BoundingBox);
					modified_flags |= cEncodeBC1BoundingBox;
				}

				int round_lr, round_lg, round_lb, round_hr, round_hg, round_hb;
				uint8_t round_sels[16];

				encode_bc1_pick_initial(pSrc_pixels, modified_flags, grayscale_flag != 0,
					min_r, min_g, min_b, max_r, max_g, max_b, 
					avg_r, avg_g, avg_b, total_r, total_g, total_b,
					round_lr, round_lg, round_lb, round_hr, round_hg, round_hb);

				int orig_round_lr = round_lr, orig_round_lg = round_lg, orig_round_lb = round_lb, orig_round_hr = round_hr, orig_round_hg = round_hg, orig_round_hb = round_hb;

				uint32_t round_err = bc1_find_sels4(flags, pSrc_pixels, round_lr, round_lg, round_lb, round_hr, round_hg, round_hb, round_sels, UINT32_MAX);
						
				const uint32_t total_ls_passes = flags & cEncodeBC1TwoLeastSquaresPasses ? 2 : 1;
				for (uint32_t ls_pass = 0; ls_pass < total_ls_passes; ls_pass++)
				{
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;
					if (!compute_least_squares_endpoints4_rgb(pSrc_pixels, round_sels, &xl, &xh, total_r, total_g, total_b))
					{
						// All selectors equal - treat it as a solid block which should always be equal or better.
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;

						// In high/higher quality mode, let it try again in case the optimal tables have caused the sels to diverge.
					}
					else
					{
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}

					if ((round_lr == trial_lr) && (round_lg == trial_lg) && (round_lb == trial_lb) && (round_hr == trial_hr) && (round_hg == trial_hg) && (round_hb == trial_hb))
						break;
			
					uint8_t trial_sels[16];
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, round_err);
														
					if (trial_err < round_err)
					{
						round_lr = trial_lr;
						round_lg = trial_lg;
						round_lb = trial_lb;

						round_hr = trial_hr;
						round_hg = trial_hg;
						round_hb = trial_hb;

						round_err = trial_err;
						memcpy(round_sels, trial_sels, 16);
					}
					else
						break;

				} // ls_pass

				if (round_err <= cur_err)
				{
					cur_err = round_err;
				
					lr = round_lr;
					lg = round_lg;
					lb = round_lb;
					hr = round_hr;
					hg = round_hg;
					hb = round_hb;

					orig_lr = orig_round_lr;
					orig_lg = orig_round_lg;
					orig_lb = orig_round_lb;
					orig_hr = orig_round_hr;
					orig_hg = orig_round_hg;
					orig_hb = orig_round_hb;

					memcpy(sels, round_sels, 16);
				}

			} // round
		}
				
		if ((cur_err) && (flags & cEncodeBC1UseLikelyTotalOrderings))
		{
			assert(needs_block_error);

			const uint32_t total_iters = (flags & cEncodeBC1Iterative) ? 2 : 1;
			for (uint32_t iter_index = 0; iter_index < total_iters; iter_index++)
			{
				const uint32_t orig_err = cur_err;
								
				hist4 h;
				for (uint32_t i = 0; i < 16; i++)
				{
					assert(sels[i] < 4);
					h.m_hist[sels[i]]++;
				}

				const uint32_t orig_total_order_index = h.lookup_total_ordering_index();

				int r0, g0, b0, r3, g3, b3;
				r0 = (lr << 3) | (lr >> 2); g0 = (lg << 2) | (lg >> 4); b0 = (lb << 3) | (lb >> 2);
				r3 = (hr << 3) | (hr >> 2); g3 = (hg << 2) | (hg >> 4); b3 = (hb << 3) | (hb >> 2);
										
				int ar = r3 - r0, ag = g3 - g0, ab = b3 - b0;
												
				int dots[16];
				for (uint32_t i = 0; i < 16; i++)
				{
					int r = pSrc_pixels[i].r;
					int g = pSrc_pixels[i].g;
					int b = pSrc_pixels[i].b;
					int d = 0x1000000 + (r * ar + g * ag + b * ab);
					assert(d >= 0);
					dots[i] = (d << 4) + i;
				}

				std::sort(dots, dots + 16);
								
				uint32_t r_sum[17], g_sum[17], b_sum[17];
				uint32_t r = 0, g = 0, b = 0;
				for (uint32_t i = 0; i < 16; i++)
				{
					const uint32_t p = dots[i] & 15;

					r_sum[i] = r;
					g_sum[i] = g;
					b_sum[i] = b;
										
					r += pSrc_pixels[p].r;
					g += pSrc_pixels[p].g;
					b += pSrc_pixels[p].b;
				}

				r_sum[16] = total_r;
				g_sum[16] = total_g;
				b_sum[16] = total_b;

				const uint32_t q_total = (flags & cEncodeBC1Exhaustive) ? NUM_UNIQUE_TOTAL_ORDERINGS4 : clampi(total_orderings_to_try, MIN_TOTAL_ORDERINGS, MAX_TOTAL_ORDERINGS4);
				for (uint32_t q = 0; q < q_total; q++)
				{
					const uint32_t s = (flags & cEncodeBC1Exhaustive) ? q : g_best_total_orderings4[orig_total_order_index][q];
	
					int trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb;

					vec3F xl, xh;

					if ((s == TOTAL_ORDER_4_0_16) || (s == TOTAL_ORDER_4_1_16) || (s == TOTAL_ORDER_4_2_16) || (s == TOTAL_ORDER_4_3_16))
					{
						trial_lr = g_bc1_match5_equals_1[avg_r].m_hi;
						trial_lg = g_bc1_match6_equals_1[avg_g].m_hi;
						trial_lb = g_bc1_match5_equals_1[avg_b].m_hi;

						trial_hr = g_bc1_match5_equals_1[avg_r].m_lo;
						trial_hg = g_bc1_match6_equals_1[avg_g].m_lo;
						trial_hb = g_bc1_match5_equals_1[avg_b].m_lo;
					}
					else
					{
						compute_least_squares_endpoints4_rgb(&xl, &xh, total_r, total_g, total_b, 
							g_selector_factors4[s][0], g_selector_factors4[s][1], g_selector_factors4[s][2], s, r_sum, g_sum, b_sum);
				
						precise_round_565(xl, xh, trial_hr, trial_hg, trial_hb, trial_lr, trial_lg, trial_lb);
					}
										
					uint8_t trial_sels[16];
					
					uint32_t trial_err = bc1_find_sels4(flags, pSrc_pixels, trial_lr, trial_lg, trial_lb, trial_hr, trial_hg, trial_hb, trial_sels, cur_err);

					if (trial_err < cur_err)
					{
						cur_err = trial_err;

						lr = trial_lr;
						lg = trial_lg;
						lb = trial_lb;

						hr = trial_hr;
						hg = trial_hg;
						hb = trial_hb;

						memcpy(sels, trial_sels, 16);
					}

				} // s

				if ((!cur_err) || (cur_err == orig_err))
					break;
			
			} // iter_index
		}
												
		if ( ((flags & (cEncodeBC1Use3ColorBlocks | cEncodeBC1Use3ColorBlocksForBlackPixels)) != 0) && (cur_err) )
		{
			if (flags & cEncodeBC1Use3ColorBlocks)
			{
				assert(needs_block_error);
				try_3color_block(pSrc_pixels, flags, cur_err, avg_r, avg_g, avg_b, orig_lr, orig_lg, orig_lb, orig_hr, orig_hg, orig_hb, total_r, total_g, total_b, total_orderings_to_try3, results);
			}

			if ((any_black_pixels) && ((flags & cEncodeBC1Use3ColorBlocksForBlackPixels) != 0))
			{
				assert(needs_block_error);
				try_3color_block_useblack(pSrc_pixels, flags, cur_err, results);
			}
		}
		
		if ( (flags & cEncodeBC1EndpointSearchRoundsMask) && (cur_err)  )
		{
			assert(needs_block_error);

			encode_bc1_endpoint_search(pSrc_pixels, any_black_pixels != 0, flags, results, cur_err);
		}

		if (results.m_3color)
			bc1_encode3(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
		else
			bc1_encode4(pDst_block, results.lr, results.lg, results.lb, results.hr, results.hg, results.hb, results.sels);
	}